

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testsc.c
# Opt level: O2

void test_mp_arithmetic(_func_mp_int_ptr_mp_int_ptr_mp_int_ptr *mp_arith)

{
  mp_int *x;
  mp_int *x_00;
  size_t sVar1;
  mp_int *x_01;
  size_t i;
  ulong uVar2;
  
  x = mp_new(0x100);
  x_00 = mp_new(0x200);
  uVar2 = 0;
  while( true ) {
    sVar1 = (*looplimit)(0x10);
    if (sVar1 <= uVar2) break;
    mp_random_fill(x);
    mp_random_fill(x_00);
    log_start();
    x_01 = (*mp_arith)(x,x_00);
    log_end();
    mp_free(x_01);
    uVar2 = uVar2 + 1;
  }
  mp_free(x);
  mp_free(x_00);
  return;
}

Assistant:

static void test_mp_arithmetic(mp_int *(*mp_arith)(mp_int *x, mp_int *y))
{
    mp_int *a = mp_new(256), *b = mp_new(512);
    for (size_t i = 0; i < looplimit(16); i++) {
        mp_random_fill(a);
        mp_random_fill(b);
        log_start();
        mp_int *r = mp_arith(a, b);
        log_end();
        mp_free(r);
    }
    mp_free(a);
    mp_free(b);
}